

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall
spv::Function::Function
          (Function *this,Id id,Id resultType,Id functionType,Id firstParamId,Module *parent)

{
  Id IVar1;
  Instruction *pIVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Instruction *param;
  
  this->_vptr_Function = (_func_int **)&PTR__Function_001e3d68;
  this->parent = parent;
  pIVar2 = &this->functionInstruction;
  (this->functionInstruction)._vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
  (this->functionInstruction).resultId = id;
  (this->functionInstruction).typeId = resultType;
  (this->functionInstruction).opCode = OpFunction;
  (this->functionInstruction).operands.
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functionInstruction).operands.
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functionInstruction).operands.
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->functionInstruction).block = (Block *)0x0;
  (this->parameterInstructions).
  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameterInstructions).
  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameterInstructions).
  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blocks).super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blocks).super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->implicitThis = false;
  Instruction::addImmediateOperand(pIVar2,0);
  Instruction::addIdOperand(pIVar2,functionType);
  Module::mapInstruction(parent,pIVar2);
  Module::addFunction(parent,this);
  pIVar2 = (parent->idToInstruction).
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[functionType];
  iVar4 = (int)((ulong)((long)*(pointer *)
                               ((long)&(pIVar2->operands).
                                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                       ._M_impl + 8) -
                       *(long *)&(pIVar2->operands).
                                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data) >> 2);
  iVar3 = 1;
  if (1 < iVar4) {
    iVar3 = iVar4;
  }
  for (uVar5 = 0; iVar3 - 1 != uVar5; uVar5 = uVar5 + 1) {
    param = (Instruction *)dxil_spv::allocate_in_thread(0x38);
    IVar1 = *(Id *)(*(long *)&(pIVar2->operands).
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data + 4 + uVar5 * 4);
    param->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
    param->resultId = firstParamId + (int)uVar5;
    param->typeId = IVar1;
    param->opCode = OpFunctionParameter;
    (param->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (param->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (param->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    param->block = (Block *)0x0;
    Module::mapInstruction(parent,param);
    std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
              (&this->parameterInstructions,&param);
  }
  return;
}

Assistant:

__inline Function::Function(Id id, Id resultType, Id functionType, Id firstParamId, Module& parent)
    : parent(parent), functionInstruction(id, resultType, OpFunction), implicitThis(false)
{
    // OpFunction
    functionInstruction.addImmediateOperand(FunctionControlMaskNone);
    functionInstruction.addIdOperand(functionType);
    parent.mapInstruction(&functionInstruction);
    parent.addFunction(this);

    // OpFunctionParameter
    Instruction* typeInst = parent.getInstruction(functionType);
    int numParams = typeInst->getNumOperands() - 1;
    for (int p = 0; p < numParams; ++p) {
        Instruction* param = new Instruction(firstParamId + p, typeInst->getIdOperand(p + 1), OpFunctionParameter);
        parent.mapInstruction(param);
        parameterInstructions.push_back(param);
    }
}